

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

_Bool bitset_bitset_container_ixor
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  bitset_container_t *in_RDX;
  bitset_container_t *in_RSI;
  undefined8 in_RDI;
  int card;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  iVar1 = bitset_container_xor
                    (in_RSI,in_RDX,
                     (bitset_container_t *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (0x1000 < iVar1) {
    *(undefined8 *)in_RDX = in_RDI;
  }
  else {
    paVar2 = array_container_from_bitset(in_RDX);
    *(array_container_t **)in_RDX = paVar2;
    bitset_container_free((bitset_container_t *)0x166db4);
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_bitset_container_ixor(bitset_container_t *src_1,
                                  const bitset_container_t *src_2,
                                  container_t **dst) {
    int card = bitset_container_xor(src_1, src_2, src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else {
        *dst = src_1;
        return true;
    }
}